

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCas.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkCascade(Abc_Ntk_t *pNtk,int nLutSize,int fCheck,int fVerbose)

{
  DdManager *pDVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  DdNode **pOutputs;
  undefined8 uVar7;
  char *pFileGeneric;
  Abc_Ntk_t *pNtk_00;
  long lVar8;
  long lVar9;
  int iVar10;
  Vec_Ptr_t *pVVar11;
  int iVar12;
  timespec ts;
  
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCas.c"
                  ,0x47,"Abc_Ntk_t *Abc_NtkCascade(Abc_Ntk_t *, int, int, int)");
  }
  pNtk_00 = (Abc_Ntk_t *)0x0;
  pvVar6 = Abc_NtkBuildGlobalBdds(pNtk,500000,1,1,0,fVerbose);
  if (pvVar6 != (void *)0x0) {
    if (fVerbose != 0) {
      if (pNtk->vAttrs->nSize < 8) goto LAB_0029fd9a;
      pDVar1 = *(DdManager **)((long)pNtk->vAttrs->pArray[7] + 0x10);
      uVar4 = Cudd_ReadKeys(pDVar1);
      uVar5 = Cudd_ReadDead(pDVar1);
      iVar3 = 0x9854e8;
      printf("Shared BDD size = %6d nodes.  ",(ulong)(uVar4 - uVar5));
      Abc_Print(iVar3,"%s =","BDD construction time");
      iVar12 = 3;
      iVar3 = clock_gettime(3,(timespec *)&ts);
      if (iVar3 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      Abc_Print(iVar12,"%9.2f sec\n",(double)(lVar9 + lVar8) / 1000000.0);
    }
    if (pNtk->vAttrs->nSize < 8) {
LAB_0029fd9a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pDVar1 = *(DdManager **)((long)pNtk->vAttrs->pArray[7] + 0x10);
    pVVar11 = pNtk->vCos;
    iVar3 = pVVar11->nSize;
    pOutputs = (DdNode **)malloc((long)iVar3 * 8);
    if (0 < (long)iVar3) {
      lVar8 = 0;
      do {
        lVar9 = *(long *)(*pVVar11->pArray[lVar8] + 0x1b0);
        if (*(int *)(lVar9 + 4) < 8) goto LAB_0029fd9a;
        piVar2 = *(int **)(*(long *)(lVar9 + 8) + 0x38);
        if (*(void **)(piVar2 + 2) == (void *)0x0) {
          __assert_fail("p->pArrayPtr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                        ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
        }
        iVar3 = (int)*(long *)((long)pVVar11->pArray[lVar8] + 0x10);
        lVar9 = (long)iVar3;
        iVar12 = *piVar2;
        if (iVar12 <= iVar3) {
          iVar10 = iVar3 + 10;
          if (iVar3 < iVar12 * 2) {
            iVar10 = iVar12 * 2;
          }
          if (iVar12 < iVar10) {
            pvVar6 = realloc(*(void **)(piVar2 + 2),(long)iVar10 * 8);
            *(void **)(piVar2 + 2) = pvVar6;
            memset((void *)((long)pvVar6 + (long)*piVar2 * 8),0,((long)iVar10 - (long)*piVar2) * 8);
            *piVar2 = iVar10;
          }
        }
        if ((*(long *)(*(long *)(piVar2 + 2) + lVar9 * 8) == 0) &&
           (*(code **)(piVar2 + 8) != (code *)0x0)) {
          uVar7 = (**(code **)(piVar2 + 8))(*(undefined8 *)(piVar2 + 4));
          *(undefined8 *)(*(long *)(piVar2 + 2) + lVar9 * 8) = uVar7;
        }
        pOutputs[lVar8] = *(DdNode **)(*(long *)(piVar2 + 2) + lVar9 * 8);
        lVar8 = lVar8 + 1;
        pVVar11 = pNtk->vCos;
      } while (lVar8 < pVVar11->nSize);
    }
    pFileGeneric = Extra_FileNameGeneric(pNtk->pSpec);
    Abc_CascadeExperiment
              (pFileGeneric,pDVar1,pOutputs,pNtk->vCis->nSize,pNtk->vCos->nSize,nLutSize,fCheck,
               fVerbose);
    pNtk_00 = Abc_NtkDup(pNtk);
    Abc_NtkFreeGlobalBdds(pNtk,1);
    if (pOutputs != (DdNode **)0x0) {
      free(pOutputs);
    }
    if (pFileGeneric != (char *)0x0) {
      free(pFileGeneric);
    }
    iVar3 = Abc_NtkCheck(pNtk_00);
    if (iVar3 == 0) {
      puts("Abc_NtkCollapse: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
      pNtk_00 = (Abc_Ntk_t *)0x0;
    }
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkCascade( Abc_Ntk_t * pNtk, int nLutSize, int fCheck, int fVerbose )
{
    DdManager * dd;
    DdNode ** ppOutputs;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode;
    char * pFileGeneric;
    int fBddSizeMax = 500000;
    int i, fReorder = 1;
    abctime clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) );
    // compute the global BDDs
    if ( Abc_NtkBuildGlobalBdds(pNtk, fBddSizeMax, 1, fReorder, 0, fVerbose) == NULL )
        return NULL;

    if ( fVerbose )
    {
        DdManager * dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
        printf( "Shared BDD size = %6d nodes.  ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
        ABC_PRT( "BDD construction time", Abc_Clock() - clk );
    }

    // collect global BDDs
    dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
    ppOutputs = ABC_ALLOC( DdNode *, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        ppOutputs[i] = (DdNode *)Abc_ObjGlobalBdd(pNode);

    // call the decomposition
    pFileGeneric = Extra_FileNameGeneric( pNtk->pSpec );
    if ( !Abc_CascadeExperiment( pFileGeneric, dd, ppOutputs, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), nLutSize, fCheck, fVerbose ) )
    {
        // the LUT size is too small
    }

    // for now, duplicate the network
    pNtkNew = Abc_NtkDup( pNtk );

    // cleanup
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    ABC_FREE( ppOutputs );
    ABC_FREE( pFileGeneric );

//    if ( pNtk->pExdc )
//        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCollapse: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}